

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O2

ch_token_kind parse_token_kind(char *token_start,size_t token_size)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  long lVar3;
  
  lVar3 = 8;
  while( true ) {
    if (lVar3 == 200) {
      return TK_ID;
    }
    __s = *(char **)((long)&__do_global_dtors_aux_fini_array_entry + lVar3);
    sVar2 = strlen(__s);
    if ((sVar2 == token_size) && (iVar1 = strncmp(token_start,__s,token_size), iVar1 == 0)) break;
    lVar3 = lVar3 + 0x10;
  }
  return *(ch_token_kind *)((long)&keywords[0].name + lVar3);
}

Assistant:

ch_token_kind parse_token_kind(const char *token_start, size_t token_size) {
  for (uint8_t i = 0; i < num_keywords; i++) {
    if (token_size != strlen(keywords[i].name)) {
      continue;
    }

    if (strncmp(token_start, keywords[i].name, token_size) == 0) {
      return keywords[i].kind;
    }
  }

  return TK_ID;
}